

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,-1,1,true>,-1,1,false>const,-1,1,false>const>>
::redux<Eigen::internal::scalar_sum_op<float,float>>
          (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,_1,1,false>const,_1,1,false>const>>
           *this,scalar_sum_op<float,_float> *func)

{
  bool bVar1;
  variable_if_dynamic<long,__1> func_00;
  Index IVar2;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
  *pCVar3;
  Scalar SVar4;
  undefined1 local_38 [8];
  ThisEvaluator thisEval;
  scalar_sum_op<float,_float> *func_local;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
  *this_local;
  
  thisEval.
  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
  .
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
  .m_d.argImpl.
  super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
  .
  super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  .m_outerStride.m_value = (long)func;
  IVar2 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>_>
          ::rows((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                  *)this);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>_>
            ::cols((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                    *)this);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 8>, -1, 1, true>, -1, 1>, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>, const Eigen::Block<const Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, 8>, -1, 1, true>, -1, 1>, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                 );
  }
  pCVar3 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>_>
           ::derived((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                      *)this);
  internal::
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>_>
  ::redux_evaluator((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                     *)local_38,pCVar3);
  func_00 = thisEval.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
            .m_d.argImpl.
            super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
            .
            super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
            .m_outerStride;
  pCVar3 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>_>
           ::derived((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                      *)this);
  SVar4 = internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,-1,1,true>,-1,1,false>const,-1,1,false>const>>,3,0>
          ::
          run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,_1,1,false>const,_1,1,false>const>>
                    ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                      *)local_38,(scalar_sum_op<float,_float> *)func_00.m_value,pCVar3);
  internal::
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_-1,_1,_false>,_-1,_1,_false>_>_>
  ::~redux_evaluator((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                      *)local_38);
  return SVar4;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}